

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

ssize_t __thiscall
kj::anon_unknown_31::HttpFixedLengthEntityWriter::write
          (HttpFixedLengthEntityWriter *this,int __fd,void *__buf,size_t __n)

{
  Disposer *pDVar1;
  undefined8 uVar2;
  Disposer *pDVar3;
  undefined4 in_register_00000034;
  Promise<void> *promise;
  long lVar4;
  Promise<void> PVar5;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> pieces;
  Fault f;
  undefined1 local_38 [16];
  AsyncOutputStream local_28;
  HttpOutputStream *pHStack_20;
  
  promise = (Promise<void> *)CONCAT44(in_register_00000034,__fd);
  if (__n == 0) {
    pDVar3 = (Disposer *)0x0;
  }
  else {
    lVar4 = 0;
    pDVar3 = (Disposer *)0x0;
    do {
      pDVar3 = (Disposer *)((long)&pDVar3->_vptr_Disposer + *(long *)((long)__buf + lVar4 + 8));
      lVar4 = lVar4 + 0x10;
    } while (__n << 4 != lVar4);
  }
  if (pDVar3 == (Disposer *)0x0) {
    heap<kj::_::ImmediatePromiseNode<kj::_::Void>,kj::_::Void>((Void *)&local_28);
    (this->super_AsyncOutputStream)._vptr_AsyncOutputStream = local_28._vptr_AsyncOutputStream;
    this->inner = pHStack_20;
  }
  else {
    pDVar1 = promise[1].super_PromiseBase.node.disposer;
    if (pDVar1 < pDVar3) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[25]>
                ((Fault *)&local_28,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x72b,FAILED,"size <= length","\"overwrote Content-Length\"",
                 (char (*) [25])"overwrote Content-Length");
      _::Debug::Fault::fatal((Fault *)&local_28);
    }
    promise[1].super_PromiseBase.node.disposer = (Disposer *)((long)pDVar1 - (long)pDVar3);
    pieces.size_ = (size_t)__buf;
    pieces.ptr = (ArrayPtr<const_unsigned_char> *)(promise->super_PromiseBase).node.ptr;
    HttpOutputStream::writeBodyData((HttpOutputStream *)local_38,pieces);
    PVar5 = maybeFinishAfter(this,promise);
    uVar2 = local_38._8_8_;
    if ((Disposer *)local_38._8_8_ != (Disposer *)0x0) {
      local_38._8_8_ = (Disposer *)0x0;
      (***(_func_int ***)local_38._0_8_)
                (local_38._0_8_,(*(_func_int ***)uVar2)[-2] + (long)(_func_int ***)uVar2,
                 PVar5.super_PromiseBase.node.ptr);
    }
  }
  return (ssize_t)this;
}

Assistant:

Promise<void> write(ArrayPtr<const ArrayPtr<const byte>> pieces) override {
    uint64_t size = 0;
    for (auto& piece: pieces) size += piece.size();

    if (size == 0) return kj::READY_NOW;
    KJ_REQUIRE(size <= length, "overwrote Content-Length");
    length -= size;

    return maybeFinishAfter(inner.writeBodyData(pieces));
  }